

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O3

void com_deblock_lcu_row(com_core_t *core,int lcu_y)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  com_seqh_t *pcVar8;
  com_pic_header_t *pcVar9;
  com_pic_t *pcVar10;
  s8 *psVar11;
  int iVar12;
  int iVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  ushort *puVar22;
  int iVar23;
  char *pcVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  int local_f4;
  int local_e4;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  pel *local_90;
  pel *local_80;
  
  pcVar8 = core->seqhdr;
  pcVar9 = core->pichdr;
  iVar3 = pcVar8->pic_width_in_lcu;
  bVar14 = (char)pcVar8->bit_depth_internal - 8;
  iVar4 = pcVar9->fixed_picture_qp_flag;
  uVar34 = pcVar8->max_cuwh * lcu_y;
  iVar20 = pcVar8->max_cuwh + uVar34;
  if (pcVar8->pic_height <= iVar20) {
    iVar20 = pcVar8->pic_height;
  }
  iVar5 = pcVar8->bit_depth_2_qp_offset;
  if (iVar4 != 0) {
    iVar12 = (core->map).map_qp[lcu_y * iVar3] - iVar5;
    iVar28 = iVar12 * 2 >> 1;
    iVar6 = pcVar9->alpha_c_offset;
    uVar29 = iVar28 + iVar6;
    if (0x3e < (int)uVar29) {
      uVar29 = 0x3f;
    }
    uVar32 = 0;
    if ((int)uVar29 < 1) {
      uVar29 = uVar32;
    }
    iVar25 = pcVar9->beta_offset;
    local_f4 = (uint)""[uVar29] << (bVar14 & 0x1f);
    uVar29 = iVar28 + iVar25;
    if (0x3e < (int)uVar29) {
      uVar29 = 0x3f;
    }
    if ((int)uVar29 < 1) {
      uVar29 = uVar32;
    }
    local_d4 = (uint)""[uVar29] << (bVar14 & 0x1f);
    uVar29 = pcVar9->chroma_quant_param_delta_cb + iVar12;
    uVar21 = uVar29;
    if (-1 < (int)uVar29) {
      uVar16 = 0x3f;
      if (uVar29 < 0x3f) {
        uVar16 = (ulong)uVar29;
      }
      uVar21 = (uint)""[uVar16];
    }
    iVar28 = uVar21 + iVar5;
    if (iVar28 < 1) {
      iVar28 = 0;
    }
    uVar21 = (iVar28 - iVar5) + iVar6;
    if (0x3e < (int)uVar21) {
      uVar21 = 0x3f;
    }
    if ((int)uVar21 < 1) {
      uVar21 = uVar32;
    }
    local_c8 = (uint)""[uVar21] << (bVar14 & 0x1f);
    uVar21 = (iVar28 - iVar5) + iVar25;
    if (0x3e < (int)uVar21) {
      uVar21 = 0x3f;
    }
    if ((int)uVar21 < 1) {
      uVar21 = uVar32;
    }
    local_cc = (uint)""[uVar21] << (bVar14 & 0x1f);
    uVar21 = iVar12 + pcVar9->chroma_quant_param_delta_cr;
    uVar32 = uVar21;
    if (-1 < (int)uVar21) {
      uVar16 = 0x3f;
      if (uVar21 < 0x3f) {
        uVar16 = (ulong)uVar21;
      }
      uVar32 = (uint)""[uVar16];
    }
    uVar16 = 0;
    iVar12 = uVar32 + iVar5;
    if ((int)(uVar32 + iVar5) < 1) {
      iVar12 = 0;
    }
    uVar32 = (iVar12 - iVar5) + iVar6;
    if (0x3e < (int)uVar32) {
      uVar32 = 0x3f;
    }
    uVar27 = (ulong)uVar32;
    if ((int)uVar32 < 1) {
      uVar27 = uVar16;
    }
    local_d0 = (uint)""[uVar27] << (bVar14 & 0x1f);
    uVar32 = (iVar12 - iVar5) + iVar25;
    if (0x3e < (int)uVar32) {
      uVar32 = 0x3f;
    }
    uVar27 = (ulong)uVar32;
    if ((int)uVar32 < 1) {
      uVar27 = uVar16;
    }
    local_e4 = (uint)""[uVar27] << (bVar14 & 0x1f);
    if (-1 < (int)uVar29) {
      if (0x3e < uVar29) {
        uVar29 = 0x3f;
      }
      uVar29 = (uint)""[uVar29];
    }
    iVar12 = uVar29 + iVar5;
    if ((int)(uVar29 + iVar5) < 1) {
      iVar12 = 0;
    }
    uVar29 = (iVar12 - iVar5) + iVar6;
    if (0x3e < (int)uVar29) {
      uVar29 = 0x3f;
    }
    uVar27 = (ulong)uVar29;
    if ((int)uVar29 < 1) {
      uVar27 = uVar16;
    }
    local_b8 = (uint)""[uVar27] << (bVar14 & 0x1f);
    uVar29 = (iVar12 - iVar5) + iVar25;
    if (0x3e < (int)uVar29) {
      uVar29 = 0x3f;
    }
    uVar27 = (ulong)uVar29;
    if ((int)uVar29 < 1) {
      uVar27 = uVar16;
    }
    local_bc = (uint)""[uVar27] << (bVar14 & 0x1f);
    if (-1 < (int)uVar21) {
      uVar16 = 0x3f;
      if (uVar21 < 0x3f) {
        uVar16 = (ulong)uVar21;
      }
      uVar21 = (uint)""[uVar16];
    }
    iVar12 = uVar21 + iVar5;
    if (iVar12 < 1) {
      iVar12 = 0;
    }
    uVar29 = iVar6 + (iVar12 - iVar5);
    if (0x3e < (int)uVar29) {
      uVar29 = 0x3f;
    }
    uVar16 = (ulong)uVar29;
    if ((int)uVar29 < 1) {
      uVar16 = 0;
    }
    local_c0 = (uint)""[uVar16] << (bVar14 & 0x1f);
    uVar29 = (iVar12 - iVar5) + iVar25;
    if (0x3e < (int)uVar29) {
      uVar29 = 0x3f;
    }
    uVar16 = (ulong)uVar29;
    if ((int)uVar29 < 1) {
      uVar16 = 0;
    }
    local_c4 = (uint)""[uVar16] << (bVar14 & 0x1f);
  }
  if ((int)uVar34 < iVar20) {
    pcVar10 = core->pic;
    iVar6 = pcVar10->stride_luma;
    iVar12 = pcVar10->stride_chroma;
    local_80 = pcVar10->y + (long)(int)uVar34 * (long)iVar6;
    local_90 = pcVar10->uv + (long)((int)uVar34 >> 1) * (long)iVar12;
    iVar28 = pcVar8->i_scu;
    iVar25 = iVar5 * -2 + 1;
    local_b4 = local_d4;
    local_b0 = local_f4;
    do {
      psVar11 = (core->map).map_qp;
      bVar1 = (byte)pcVar8->log2_max_cuwh;
      pcVar24 = psVar11 + ((int)uVar34 >> (bVar1 & 0x1f)) * iVar3;
      pcVar17 = psVar11 + ((int)(uVar34 - 8) >> (bVar1 & 0x1f)) * iVar3;
      if (iVar4 == 0) {
        iVar13 = (int)*pcVar24;
        iVar33 = pcVar9->alpha_c_offset;
        iVar23 = pcVar9->beta_offset;
        iVar30 = (int)pcVar9->chroma_quant_param_delta_cb;
        if (uVar34 == 0) {
          iVar13 = iVar13 - iVar5;
          uVar29 = iVar30 + iVar13;
        }
        else {
          iVar26 = (int)*pcVar17;
          iVar31 = iVar25 + iVar13 + iVar26 >> 1;
          uVar29 = iVar31 + iVar33;
          if (0x3e < (int)uVar29) {
            uVar29 = 0x3f;
          }
          uVar16 = (ulong)uVar29;
          if ((int)uVar29 < 1) {
            uVar16 = 0;
          }
          local_b0 = (uint)""[uVar16] << (bVar14 & 0x1f);
          uVar29 = iVar31 + iVar23;
          if (0x3e < (int)uVar29) {
            uVar29 = 0x3f;
          }
          if ((int)uVar29 < 1) {
            uVar29 = 0;
          }
          local_b4 = (uint)""[uVar29] << (bVar14 & 0x1f);
          iVar13 = iVar13 - iVar5;
          uVar29 = iVar13 + iVar30;
          uVar32 = uVar29;
          if (-1 < (int)uVar29) {
            uVar16 = 0x3f;
            if (uVar29 < 0x3f) {
              uVar16 = (ulong)uVar29;
            }
            uVar32 = (uint)""[uVar16];
          }
          iVar26 = iVar26 - iVar5;
          uVar21 = iVar30 + iVar26;
          if (-1 < (int)uVar21) {
            if (0x3e < uVar21) {
              uVar21 = 0x3f;
            }
            uVar21 = (uint)""[uVar21];
          }
          iVar30 = uVar32 + iVar5;
          if (iVar30 < 1) {
            iVar30 = 0;
          }
          iVar31 = uVar21 + iVar5;
          if (iVar31 < 1) {
            iVar31 = 0;
          }
          iVar30 = (iVar31 + iVar30 + 1U >> 1) - iVar5;
          uVar32 = iVar30 + iVar33;
          if (0x3e < (int)uVar32) {
            uVar32 = 0x3f;
          }
          uVar16 = (ulong)uVar32;
          if ((int)uVar32 < 1) {
            uVar16 = 0;
          }
          local_c8 = (uint)""[uVar16] << (bVar14 & 0x1f);
          uVar32 = iVar30 + iVar23;
          if (0x3e < (int)uVar32) {
            uVar32 = 0x3f;
          }
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          local_cc = (uint)""[uVar32] << (bVar14 & 0x1f);
          uVar32 = iVar13 + pcVar9->chroma_quant_param_delta_cr;
          if (-1 < (int)uVar32) {
            uVar16 = (ulong)uVar32;
            if (0x3e < uVar32) {
              uVar16 = 0x3f;
            }
            uVar32 = (uint)""[uVar16];
          }
          uVar21 = iVar26 + pcVar9->chroma_quant_param_delta_cr;
          if (-1 < (int)uVar21) {
            if (0x3e < uVar21) {
              uVar21 = 0x3f;
            }
            uVar21 = (uint)""[uVar21];
          }
          iVar30 = uVar32 + iVar5;
          if (iVar30 < 1) {
            iVar30 = 0;
          }
          iVar26 = uVar21 + iVar5;
          if (iVar26 < 1) {
            iVar26 = 0;
          }
          iVar30 = (iVar26 + iVar30 + 1U >> 1) - iVar5;
          uVar32 = iVar30 + iVar33;
          if (0x3e < (int)uVar32) {
            uVar32 = 0x3f;
          }
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          local_d0 = (uint)""[uVar32] << (bVar14 & 0x1f);
          uVar32 = iVar30 + iVar23;
          if (0x3e < (int)uVar32) {
            uVar32 = 0x3f;
          }
          if ((int)uVar32 < 1) {
            uVar32 = 0;
          }
          local_e4 = (uint)""[uVar32] << (bVar14 & 0x1f);
        }
        iVar30 = iVar13 * 2 >> 1;
        uVar32 = iVar33 + iVar30;
        if (0x3e < (int)uVar32) {
          uVar32 = 0x3f;
        }
        if ((int)uVar32 < 1) {
          uVar32 = 0;
        }
        local_f4 = (uint)""[uVar32] << (bVar14 & 0x1f);
        uVar32 = iVar30 + iVar23;
        if (0x3e < (int)uVar32) {
          uVar32 = 0x3f;
        }
        if ((int)uVar32 < 1) {
          uVar32 = 0;
        }
        local_d4 = (uint)""[uVar32] << (bVar14 & 0x1f);
        if (-1 < (int)uVar29) {
          if (0x3e < uVar29) {
            uVar29 = 0x3f;
          }
          uVar29 = (uint)""[uVar29];
        }
        iVar30 = uVar29 + iVar5;
        if (iVar30 < 1) {
          iVar30 = 0;
        }
        uVar29 = (iVar30 - iVar5) + iVar33;
        if (0x3e < (int)uVar29) {
          uVar29 = 0x3f;
        }
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        local_b8 = (uint)""[uVar29] << (bVar14 & 0x1f);
        uVar29 = (iVar30 - iVar5) + iVar23;
        if (0x3e < (int)uVar29) {
          uVar29 = 0x3f;
        }
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        local_bc = (uint)""[uVar29] << (bVar14 & 0x1f);
        uVar29 = iVar13 + pcVar9->chroma_quant_param_delta_cr;
        if (-1 < (int)uVar29) {
          if (0x3e < uVar29) {
            uVar29 = 0x3f;
          }
          uVar29 = (uint)""[uVar29];
        }
        iVar13 = uVar29 + iVar5;
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        uVar29 = iVar33 + (iVar13 - iVar5);
        if (0x3e < (int)uVar29) {
          uVar29 = 0x3f;
        }
        if ((int)uVar29 < 1) {
          uVar29 = 0;
        }
        local_c0 = (uint)""[uVar29] << (bVar14 & 0x1f);
        uVar29 = (iVar13 - iVar5) + iVar23;
        if (0x3e < (int)uVar29) {
          uVar29 = 0x3f;
        }
        uVar16 = (ulong)uVar29;
        if ((int)uVar29 < 1) {
          uVar16 = 0;
        }
        local_c4 = (uint)""[uVar16] << (bVar14 & 0x1f);
      }
      iVar33 = pcVar8->pic_width;
      if (0 < iVar33) {
        puVar22 = (ushort *)((core->map).map_edge + ((int)uVar34 >> 2) * iVar28);
        uVar16 = 0;
        do {
          if (iVar4 == 0) {
            uVar27 = (uVar16 & 0xffffffff) >> ((byte)pcVar8->log2_max_cuwh & 0x3f);
            iVar13 = (int)pcVar24[uVar27];
            iVar23 = (int)((long)((ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff)
                          % (long)pcVar8->max_cuwh);
            if (((uVar16 != 0) && (uVar34 != 0)) && (iVar23 == 0)) {
              iVar31 = (int)pcVar17[uVar27];
              iVar26 = iVar25 + iVar13 + iVar31 >> 1;
              iVar30 = pcVar9->alpha_c_offset;
              uVar29 = iVar26 + iVar30;
              if (0x3e < (int)uVar29) {
                uVar29 = 0x3f;
              }
              uVar18 = (ulong)uVar29;
              if ((int)uVar29 < 1) {
                uVar18 = 0;
              }
              local_b0 = (uint)""[uVar18] << (bVar14 & 0x1f);
              iVar7 = pcVar9->beta_offset;
              uVar29 = iVar26 + iVar7;
              if (0x3e < (int)uVar29) {
                uVar29 = 0x3f;
              }
              if ((int)uVar29 < 1) {
                uVar29 = 0;
              }
              local_b4 = (uint)""[uVar29] << (bVar14 & 0x1f);
              uVar29 = (iVar13 - iVar5) + (int)pcVar9->chroma_quant_param_delta_cb;
              if (-1 < (int)uVar29) {
                if (0x3e < uVar29) {
                  uVar29 = 0x3f;
                }
                uVar29 = (uint)""[uVar29];
              }
              iVar31 = iVar31 - iVar5;
              uVar32 = pcVar9->chroma_quant_param_delta_cb + iVar31;
              if (-1 < (int)uVar32) {
                uVar18 = (ulong)uVar32;
                if (0x3e < uVar32) {
                  uVar18 = 0x3f;
                }
                uVar32 = (uint)""[uVar18];
              }
              iVar26 = uVar29 + iVar5;
              uVar18 = 0;
              if (iVar26 < 1) {
                iVar26 = 0;
              }
              iVar15 = uVar32 + iVar5;
              if (iVar15 < 1) {
                iVar15 = 0;
              }
              iVar26 = (iVar26 + iVar15 + 1U >> 1) - iVar5;
              uVar29 = iVar26 + iVar30;
              if (0x3e < (int)uVar29) {
                uVar29 = 0x3f;
              }
              uVar19 = (ulong)uVar29;
              if ((int)uVar29 < 1) {
                uVar19 = uVar18;
              }
              local_c8 = (uint)""[uVar19] << (bVar14 & 0x1f);
              uVar29 = iVar26 + iVar7;
              if (0x3e < (int)uVar29) {
                uVar29 = 0x3f;
              }
              if (0 < (int)uVar29) {
                uVar18 = (ulong)uVar29;
              }
              local_cc = (uint)""[uVar18] << (bVar14 & 0x1f);
              uVar29 = (iVar13 - iVar5) + (int)pcVar9->chroma_quant_param_delta_cr;
              if (-1 < (int)uVar29) {
                if (0x3e < uVar29) {
                  uVar29 = 0x3f;
                }
                uVar29 = (uint)""[uVar29];
              }
              uVar32 = iVar31 + pcVar9->chroma_quant_param_delta_cr;
              if (-1 < (int)uVar32) {
                if (0x3e < uVar32) {
                  uVar32 = 0x3f;
                }
                uVar32 = (uint)""[uVar32];
              }
              iVar26 = uVar29 + iVar5;
              uVar18 = 0;
              if (iVar26 < 1) {
                iVar26 = 0;
              }
              iVar31 = uVar32 + iVar5;
              if (iVar31 < 1) {
                iVar31 = 0;
              }
              iVar26 = (iVar26 + iVar31 + 1U >> 1) - iVar5;
              uVar29 = iVar30 + iVar26;
              if (0x3e < (int)uVar29) {
                uVar29 = 0x3f;
              }
              uVar19 = (ulong)uVar29;
              if ((int)uVar29 < 1) {
                uVar19 = uVar18;
              }
              local_d0 = (uint)""[uVar19] << (bVar14 & 0x1f);
              uVar29 = iVar26 + iVar7;
              if (0x3e < (int)uVar29) {
                uVar29 = 0x3f;
              }
              if (0 < (int)uVar29) {
                uVar18 = (ulong)uVar29;
              }
              local_e4 = (uint)""[uVar18] << (bVar14 & 0x1f);
            }
            iVar30 = (int)(uVar16 + 8);
            iVar26 = (int)((long)((ulong)(uint)(iVar30 >> 0x1f) << 0x20 | uVar16 + 8 & 0xffffffff) %
                          (long)pcVar8->max_cuwh);
            if (iVar23 == 0 && uVar16 != 0) {
              uVar18 = (ulong)(iVar26 == 0);
            }
            else {
              uVar18 = 1;
              if (iVar33 <= iVar30 || iVar26 != 0) goto LAB_0011606a;
            }
            iVar23 = iVar25 + iVar13 + (int)pcVar24[uVar18 + uVar27] >> 1;
            iVar33 = pcVar9->alpha_c_offset;
            uVar29 = iVar23 + iVar33;
            if (0x3e < (int)uVar29) {
              uVar29 = 0x3f;
            }
            uVar19 = (ulong)uVar29;
            if ((int)uVar29 < 1) {
              uVar19 = 0;
            }
            local_f4 = (uint)""[uVar19] << (bVar14 & 0x1f);
            iVar30 = pcVar9->beta_offset;
            uVar29 = iVar23 + iVar30;
            if (0x3e < (int)uVar29) {
              uVar29 = 0x3f;
            }
            if ((int)uVar29 < 1) {
              uVar29 = 0;
            }
            local_d4 = (uint)""[uVar29] << (bVar14 & 0x1f);
            uVar29 = (iVar13 - iVar5) + (int)pcVar9->chroma_quant_param_delta_cb;
            if (-1 < (int)uVar29) {
              uVar19 = (ulong)uVar29;
              if (0x3e < uVar29) {
                uVar19 = 0x3f;
              }
              uVar29 = (uint)""[uVar19];
            }
            iVar23 = pcVar24[uVar18 + uVar27] - iVar5;
            uVar32 = pcVar9->chroma_quant_param_delta_cb + iVar23;
            if (-1 < (int)uVar32) {
              uVar27 = (ulong)uVar32;
              if (0x3e < uVar32) {
                uVar27 = 0x3f;
              }
              uVar32 = (uint)""[uVar27];
            }
            iVar26 = uVar29 + iVar5;
            uVar27 = 0;
            if (iVar26 < 1) {
              iVar26 = 0;
            }
            iVar31 = uVar32 + iVar5;
            if (iVar31 < 1) {
              iVar31 = 0;
            }
            iVar26 = (iVar26 + iVar31 + 1U >> 1) - iVar5;
            uVar29 = iVar26 + iVar33;
            if (0x3e < (int)uVar29) {
              uVar29 = 0x3f;
            }
            uVar18 = (ulong)uVar29;
            if ((int)uVar29 < 1) {
              uVar18 = uVar27;
            }
            local_b8 = (uint)""[uVar18] << (bVar14 & 0x1f);
            uVar29 = iVar26 + iVar30;
            if (0x3e < (int)uVar29) {
              uVar29 = 0x3f;
            }
            if (0 < (int)uVar29) {
              uVar27 = (ulong)uVar29;
            }
            local_bc = (uint)""[uVar27] << (bVar14 & 0x1f);
            uVar29 = (iVar13 - iVar5) + (int)pcVar9->chroma_quant_param_delta_cr;
            if (-1 < (int)uVar29) {
              uVar27 = (ulong)uVar29;
              if (0x3e < uVar29) {
                uVar27 = 0x3f;
              }
              uVar29 = (uint)""[uVar27];
            }
            uVar32 = iVar23 + pcVar9->chroma_quant_param_delta_cr;
            if (-1 < (int)uVar32) {
              uVar27 = (ulong)uVar32;
              if (0x3e < uVar32) {
                uVar27 = 0x3f;
              }
              uVar32 = (uint)""[uVar27];
            }
            iVar23 = uVar29 + iVar5;
            uVar27 = 0;
            if (iVar23 < 1) {
              iVar23 = 0;
            }
            iVar13 = uVar32 + iVar5;
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            iVar23 = (iVar13 + iVar23 + 1U >> 1) - iVar5;
            uVar29 = iVar33 + iVar23;
            if (0x3e < (int)uVar29) {
              uVar29 = 0x3f;
            }
            uVar18 = (ulong)uVar29;
            if ((int)uVar29 < 1) {
              uVar18 = uVar27;
            }
            local_c0 = (uint)""[uVar18] << (bVar14 & 0x1f);
            uVar29 = iVar23 + iVar30;
            if (0x3e < (int)uVar29) {
              uVar29 = 0x3f;
            }
            if (0 < (int)uVar29) {
              uVar27 = (ulong)uVar29;
            }
            local_c4 = (uint)""[uVar27] << (bVar14 & 0x1f);
          }
LAB_0011606a:
          uVar2 = CONCAT11(*(undefined1 *)((long)puVar22 + (long)(iVar28 + 2)),(char)puVar22[1]);
          uVar29 = (uint)uVar2 & 0x303;
          if ((((uVar2 & 0x303) != 0) &&
              ((*uavs3d_funs_handle.deblock_luma[0])
                         (local_80 + uVar16 + 8,iVar6,local_f4,local_d4,uVar29), (uVar16 & 8) != 0))
             && ((uVar2 & 0x202) != 0)) {
            (*uavs3d_funs_handle.deblock_chroma[0])
                      (local_90 + uVar16 + 8,iVar12,local_b8,local_bc,local_c0,local_c4,uVar29);
          }
          uVar2 = *puVar22;
          if ((((uVar2 >> 2 & 0x303) != 0) &&
              ((*uavs3d_funs_handle.deblock_luma[1])(local_80 + uVar16,iVar6,local_b0,local_b4,0),
              (uVar34 & 0xf) == 0)) && ((uVar2 >> 2 & 0x202) != 0)) {
            (*uavs3d_funs_handle.deblock_chroma[1])
                      (local_90 + uVar16,iVar12,local_c8,local_cc,local_d0,local_e4,0);
          }
          uVar16 = uVar16 + 8;
          puVar22 = puVar22 + 1;
          iVar33 = pcVar8->pic_width;
        } while ((int)uVar16 < iVar33);
      }
      local_80 = local_80 + (long)iVar6 * 8;
      local_90 = local_90 + (long)iVar12 * 4;
      uVar34 = uVar34 + 8;
    } while ((int)uVar34 < iVar20);
  }
  return;
}

Assistant:

void com_deblock_lcu_row(com_core_t *core, int lcu_y)
{
    com_seqh_t *seqhdr =  core->seqhdr;
    com_pic_header_t *pichdr =  core->pichdr;
    com_map_t *map   = &core->map;
    com_pic_t * pic  =  core->pic;
    int pix_y, pix_x;
    int i_lcu = seqhdr->pic_width_in_lcu;
    int i_scu = seqhdr->i_scu;
    int s_l = pic->stride_luma;
    int s_c = pic->stride_chroma;
    int shift = seqhdr->bit_depth_internal - 8;
    int alpha_hor_y, beta_hor_y, alpha_ver_y, beta_ver_y;
    int alpha_hor_u, beta_hor_u, alpha_ver_u, beta_ver_u;
    int alpha_hor_v, beta_hor_v, alpha_ver_v, beta_ver_v;
    int fix_qp = pichdr->fixed_picture_qp_flag;
    int pix_start_y = lcu_y * seqhdr->max_cuwh;
    int pix_end_y = COM_MIN(pix_start_y + seqhdr->max_cuwh, seqhdr->pic_height);
    pel *src_l = pic->y + pix_start_y * s_l;
    pel *src_uv = pic->uv + (pix_start_y >> 1) * s_c;
    int qp_offset = seqhdr->bit_depth_2_qp_offset;

    if (fix_qp) {
        int qp = map->map_qp[lcu_y * i_lcu];
        com_df_cal_y_param(pichdr, qp, qp, qp_offset, shift, &alpha_hor_y, &beta_hor_y);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_hor_u, &beta_hor_u, pichdr->chroma_quant_param_delta_cb);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_hor_v, &beta_hor_v, pichdr->chroma_quant_param_delta_cr);
        com_df_cal_y_param(pichdr, qp, qp, qp_offset, shift, &alpha_ver_y, &beta_ver_y);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_ver_u, &beta_ver_u, pichdr->chroma_quant_param_delta_cb);
        com_df_cal_c_param(pichdr, qp, qp, qp_offset, shift, &alpha_ver_v, &beta_ver_v, pichdr->chroma_quant_param_delta_cr);
    }

    for (pix_y = pix_start_y; pix_y < pix_end_y; pix_y += LOOPFILTER_GRID) {
        u8 *edge_flag = map->map_edge + (pix_y >> MIN_CU_LOG2) * i_scu;
        s8 *map_cur = map->map_qp + (pix_y >> seqhdr->log2_max_cuwh) * i_lcu;
        s8 *map_top = map->map_qp + ((pix_y - LOOPFILTER_GRID) >> seqhdr->log2_max_cuwh) * i_lcu;

        if (!fix_qp) {
            int qp_p = map_cur[0];
            if (pix_y) {
                int qp_q = map_top[0];
                com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_y, &beta_hor_y);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_u, &beta_hor_u, pichdr->chroma_quant_param_delta_cb);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_v, &beta_hor_v, pichdr->chroma_quant_param_delta_cr);
            }
            {
                int qp_q = qp_p;
                com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_y, &beta_ver_y);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_u, &beta_ver_u, pichdr->chroma_quant_param_delta_cb);
                com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_v, &beta_ver_v, pichdr->chroma_quant_param_delta_cr);
            }
        }
        for (pix_x = 0; pix_x < seqhdr->pic_width; pix_x += LOOPFILTER_GRID) {
            int pix_x_ver = pix_x + LOOPFILTER_GRID;

            if (!fix_qp) {
                s8 *map_qp = map_cur + (pix_x >> seqhdr->log2_max_cuwh);
                int qp_p = map_qp[0];

                if (pix_x % seqhdr->max_cuwh == 0 && pix_x && pix_y) {
                    int qp_q = map_top[pix_x >> seqhdr->log2_max_cuwh];
                    com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_y, &beta_hor_y);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_u, &beta_hor_u, pichdr->chroma_quant_param_delta_cb);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_hor_v, &beta_hor_v, pichdr->chroma_quant_param_delta_cr);
                } 
                if ((pix_x % seqhdr->max_cuwh == 0 && pix_x) || (pix_x_ver % seqhdr->max_cuwh == 0 && pix_x_ver < seqhdr->pic_width)) {
                    int qp_q;
                    if (pix_x_ver % seqhdr->max_cuwh == 0) {
                        qp_q = map_qp[1];
                    } else {
                        qp_q = map_qp[0];
                    }
                    com_df_cal_y_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_y, &beta_ver_y);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_u, &beta_ver_u, pichdr->chroma_quant_param_delta_cb);
                    com_df_cal_c_param(pichdr, qp_p, qp_q, qp_offset, shift, &alpha_ver_v, &beta_ver_v, pichdr->chroma_quant_param_delta_cr);
                }
            }

            int edge = ((edge_flag[2]) | ((edge_flag[2 + i_scu]) << 8)) & 0x0303;

            if (edge) {
                uavs3d_funs_handle.deblock_luma[0](src_l + pix_x_ver, s_l, alpha_ver_y, beta_ver_y, edge);

                if (pix_x_ver % LOOPFILTER_GRID_C == 0 && (edge & 0x0202)) {
                    uavs3d_funs_handle.deblock_chroma[0](src_uv + pix_x_ver, s_c, alpha_ver_u, beta_ver_u, alpha_ver_v, beta_ver_v, edge);
                }
            }
            
            edge = (M16(edge_flag) >> 2) & 0x0303;

            if (edge) {
                uavs3d_funs_handle.deblock_luma[1](src_l + pix_x, s_l, alpha_hor_y, beta_hor_y, edge);

                if (pix_y % LOOPFILTER_GRID_C == 0 && (edge & 0x0202)) {
                    uavs3d_funs_handle.deblock_chroma[1](src_uv + pix_x, s_c, alpha_hor_u, beta_hor_u, alpha_hor_v, beta_hor_v, edge);
                }
            }
            
            edge_flag += 2;
        }

        src_l  += s_l *  LOOPFILTER_GRID;
        src_uv += s_c * (LOOPFILTER_GRID / 2);
    }
}